

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::Directory>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryOpenSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  Mutex *this_00;
  Impl *this_01;
  uint uVar1;
  ArrayDisposer **ppAVar2;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> ctx;
  size_t sVar3;
  undefined4 in_register_0000000c;
  long lVar4;
  Directory *pDVar5;
  Directory *extraout_RDX;
  Directory *extraout_RDX_01;
  _func_int **pp_Var6;
  Directory *extraout_RDX_02;
  Directory *extraout_RDX_03;
  Directory *extraout_RDX_04;
  Directory *extraout_RDX_05;
  Directory *extraout_RDX_06;
  Directory *extraout_RDX_07;
  Directory *extraout_RDX_08;
  _func_int **pp_Var8;
  WriteMode in_R8D;
  String *pSVar9;
  Maybe<kj::Own<const_kj::Directory>_> MVar10;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  Fault f_1;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Path local_88;
  FsNode local_70;
  Maybe<kj::_::Mutex::Waiter_&> MStack_68;
  FsNode local_60;
  Clock *local_58;
  FsNode local_50;
  Mutex *local_48;
  undefined8 uStack_40;
  Directory *extraout_RDX_00;
  Directory *pDVar7;
  
  lVar4 = CONCAT44(in_register_0000000c,mode);
  pDVar5 = (Directory *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (lVar4 == 1) {
    this_00 = (Mutex *)(name_00.content.ptr + 1);
    kj::_::Mutex::lock(this_00,EXCLUSIVE);
    this_01 = (Impl *)(name_00.content.ptr + 2);
    pp_Var8 = pDVar5[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var8 == (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x515344;
    }
    else {
      pp_Var6 = (pDVar5->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name.content.size_ = (long)pp_Var8 + (ulong)(pp_Var8 == (_func_int **)0x0);
    name.content.ptr = (char *)pp_Var6;
    local_48 = this_00;
    uStack_40 = this_01;
    ctx = Impl::openEntry(this_01,name,in_R8D);
    if (ctx.ptr == (EntryImpl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      pDVar7 = extraout_RDX_00;
    }
    else {
      uVar1 = ((ctx.ptr)->node).tag;
      if (uVar1 == 0) {
        if ((in_R8D & CREATE) == 0) {
          local_60._vptr_FsNode = (_func_int **)0x0;
          local_88.parts.ptr = (String *)0x0;
          local_88.parts.size_ = 0;
          kj::_::Debug::Fault::init
                    ((Fault *)&local_60,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)&local_60);
        }
        sVar3 = (*(code *)**(undefined8 **)this_01->clock)();
        name_00.content.ptr[4].content.size_ = sVar3;
        atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
                  ((kj *)&local_88,(Clock *)name_00.content.ptr[2].content.ptr);
        local_70._vptr_FsNode = (_func_int **)local_88.parts.ptr;
        MStack_68.ptr = (Waiter *)local_88.parts.size_;
        EntryImpl::init((EntryImpl *)&local_60,(EVP_PKEY_CTX *)ctx.ptr);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             local_60._vptr_FsNode;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_58;
        local_58 = (Clock *)0x0;
        pDVar7 = extraout_RDX_04;
        if (MStack_68.ptr != (Waiter *)0x0) {
          MStack_68.ptr = (Waiter *)0x0;
          (**(code **)((Array<char> *)local_70._vptr_FsNode)->ptr)();
          pDVar7 = extraout_RDX_05;
        }
      }
      else if (uVar1 == 3) {
        SymlinkNode::parse(&local_88,(SymlinkNode *)&((ctx.ptr)->node).field_1);
        kj::_::Mutex::unlock(this_00,EXCLUSIVE);
        local_48 = (Mutex *)0x0;
        uStack_40 = (Impl *)0x0;
        path_00.parts.size_ = (size_t)local_88.parts.ptr;
        path_00.parts.ptr = name_00.content.ptr;
        MVar10 = tryOpenSubdir(this,path_00,(WriteMode)local_88.parts.size_);
        sVar3 = local_88.parts.size_;
        pSVar9 = local_88.parts.ptr;
        pDVar7 = MVar10.ptr.ptr;
        if (local_88.parts.ptr != (String *)0x0) {
          local_88.parts.ptr = (String *)0x0;
          local_88.parts.size_ = 0;
          (**(local_88.parts.disposer)->_vptr_ArrayDisposer)
                    (local_88.parts.disposer,pSVar9,0x18,sVar3,sVar3,
                     ArrayDisposer::Dispose_<kj::String,_false>::destruct);
          pDVar7 = extraout_RDX_03;
        }
      }
      else if (uVar1 == 2) {
        (**(code **)(**(long **)((long)&((ctx.ptr)->node).field_1 + 8) + 0x28))(&local_88);
        pp_Var8 = (_func_int **)local_88.parts.size_;
        if ((_func_int **)local_88.parts.size_ == (_func_int **)0x0) {
          pp_Var8 = (_func_int **)0x0;
          pSVar9 = (String *)0x0;
        }
        else {
          local_88.parts.size_ = 0;
          pSVar9 = local_88.parts.ptr;
        }
        pDVar7 = extraout_RDX_01;
        if ((_func_int **)local_88.parts.size_ != (_func_int **)0x0) {
          local_88.parts.size_ = 0;
          (**(code **)*(_func_int **)local_88.parts.ptr)();
          pDVar7 = extraout_RDX_07;
        }
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)pSVar9;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var8;
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
                  ((Fault *)&local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x676,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x57e8fd);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)&local_88);
        pDVar7 = extraout_RDX_06;
      }
    }
    if (local_48 != (Mutex *)0x0) {
      kj::_::Mutex::unlock(local_48,EXCLUSIVE);
      pDVar7 = extraout_RDX_08;
    }
  }
  else if (lVar4 == 0) {
    pDVar7 = pDVar5;
    if ((in_R8D & MODIFY) == 0) {
      if ((in_R8D & CREATE) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                  ((Fault *)&local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x495,FAILED,(char *)0x0,"\"can\'t replace self\"",
                   (char (*) [19])"can\'t replace self");
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)&local_88);
        pDVar7 = extraout_RDX;
      }
      else {
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      }
    }
    else {
      LOCK();
      ppAVar2 = &((name_00.content.ptr)->content).disposer;
      *(int *)ppAVar2 = *(int *)ppAVar2 + 1;
      UNLOCK();
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)&((name_00.content.ptr)->content).size_;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
           (_func_int **)name_00.content.ptr;
    }
  }
  else {
    pp_Var8 = pDVar5[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var8 == (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x515344;
    }
    else {
      pp_Var6 = (pDVar5->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var6;
    MVar10 = tryGetParent((InMemoryDirectory *)&local_88,name_00,
                          (int)pp_Var8 + (uint)(pp_Var8 == (_func_int **)0x0));
    pDVar7 = MVar10.ptr.ptr;
    local_50._vptr_FsNode = (_func_int **)local_88.parts.ptr;
    if ((_func_int **)local_88.parts.size_ == (_func_int **)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)local_88.parts.size_ + 0x88))
                (this,local_88.parts.size_,pDVar5 + 3,lVar4 + -1,in_R8D);
      (**(code **)*local_50._vptr_FsNode)
                (local_50._vptr_FsNode,
                 local_88.parts.size_ + *(long *)(*(_func_int **)local_88.parts.size_ + -0x10));
      pDVar7 = extraout_RDX_02;
    }
  }
  MVar10.ptr.ptr = pDVar7;
  MVar10.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory>_>)MVar10.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        return atomicAddRef(*this);
      } else if (has(mode, WriteMode::CREATE)) {
        return nullptr;  // already exists
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return nullptr; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        return asDirectory(lock, *entry, mode);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->tryOpenSubdir(path.slice(1, path.size()), mode);
      } else {
        return nullptr;
      }
    }
  }